

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<unsigned_long> *value)

{
  bool bVar1;
  optional<unsigned_long> local_40;
  uint64_t local_30;
  uint64_t v;
  optional<unsigned_long> *local_20;
  optional<unsigned_long> *value_local;
  AsciiParser *this_local;
  
  local_20 = value;
  value_local = (optional<unsigned_long> *)this;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<unsigned_long>::operator=(local_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_30);
    if (bVar1) {
      nonstd::optional_lite::optional<unsigned_long>::optional<unsigned_long_&,_0>
                (&local_40,&local_30);
      nonstd::optional_lite::optional<unsigned_long>::operator=(local_20,&local_40);
      nonstd::optional_lite::optional<unsigned_long>::~optional(&local_40);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<uint64_t> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  uint64_t v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}